

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::update_privileged_ports(session_impl *this)

{
  ulong uVar1;
  pointer psVar2;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar3;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &(this->m_settings).m_mutex;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  uVar1 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if ((uVar1 >> 0x2b & 1) != 0) {
    psVar2 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar3 = (this->m_torrents).m_array.
                  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar2; psVar3 = psVar3 + 1)
    {
      torrent::privileged_port_updated
                ((psVar3->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
    }
  }
  return;
}

Assistant:

void session_impl::update_privileged_ports()
	{
		if (m_settings.get_bool(settings_pack::no_connect_privileged_ports))
		{
			// Close connections whose endpoint is filtered
			// by the new setting
			for (auto const& t : m_torrents)
				t->privileged_port_updated();
		}
	}